

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  char c;
  int p;
  queue<int> q;
  byte local_55;
  int local_54;
  queue<int> local_50;
  
  CP::queue<int>::queue(&local_50);
  do {
    __isoc99_scanf("%c",&local_55);
    switch(local_55) {
    case 0x6d:
      __isoc99_scanf("%d",&local_54);
      CP::queue<int>::move_to_front(&local_50,(long)local_54);
      break;
    case 0x6f:
      CP::queue<int>::pop(&local_50);
      break;
    case 0x70:
      CP::queue<int>::print(&local_50);
      break;
    case 0x71:
      CP::queue<int>::~queue(&local_50);
      return 0;
    case 0x75:
      __isoc99_scanf("%d",&local_54);
      CP::queue<int>::push(&local_50,&local_54);
    }
  } while( true );
}

Assistant:

int main() {
  CP::queue<int> q;
  char c;
  scanf("%c", &c);
  while (c != 'q') {
    if (c == 'u') {
      // add data
      int v;
      scanf("%d", &v);
      q.push(v);
    } else if (c == 'o') {
      q.pop();
    } else if (c == 'p') {
      q.print();
    } else if (c == 'm') {
      int p;
      scanf("%d", &p);
      q.move_to_front(p);
    }
    scanf("%c", &c);
  }
  return 0;
}